

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *popped_item)

{
  async_msg *this_00;
  condition_variable *in_RDI;
  unique_lock<std::mutex> lock;
  async_msg *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  anon_class_8_1_8991fb9c __p;
  
  __p.this = (mpmc_blocking_queue<spdlog::details::async_msg> *)&stack0xffffffffffffffe0;
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffffb0,(mutex_type *)in_stack_ffffffffffffffa8);
  std::condition_variable::
  wait<spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue(spdlog::details::async_msg&)::_lambda()_1_>
            (in_RDI,in_stack_ffffffffffffffb0,__p);
  this_00 = circular_q<spdlog::details::async_msg>::front
                      ((circular_q<spdlog::details::async_msg> *)0x6e71ba);
  async_msg::operator=(this_00,in_stack_ffffffffffffffa8);
  circular_q<spdlog::details::async_msg>::pop_front
            ((circular_q<spdlog::details::async_msg> *)(in_RDI + 0x88));
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void dequeue(T &popped_item) {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            push_cv_.wait(lock, [this] { return !this->q_.empty(); });
            popped_item = std::move(q_.front());
            q_.pop_front();
        }
        pop_cv_.notify_one();
    }